

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall QIODevice::canReadLine(QIODevice *this)

{
  QObjectData *pQVar1;
  QBindingStorageData *pQVar2;
  QRingBuffer *this_00;
  int iVar3;
  qint64 qVar4;
  QDynamicMetaObjectData *pos;
  size_t maxLength;
  bool bVar5;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  pQVar2 = pQVar1[1].bindingStorage.d;
  if (pQVar2 == (QBindingStorageData *)0x0) {
    maxLength = 0;
  }
  else {
    maxLength = pQVar2[1].used;
  }
  if (*(char *)((long)&pQVar1[4].bindingStorage.d + 6) == '\0') {
    iVar3 = (*pQVar1->q_ptr->_vptr_QObject[0xc])();
    *(char *)((long)&pQVar1[4].bindingStorage.d + 6) = '\x02' - (char)iVar3;
  }
  if (*(char *)((long)&pQVar1[4].bindingStorage.d + 6) == '\x01') {
    pos = pQVar1[1].metaObject;
  }
  else {
    pos = (QDynamicMetaObjectData *)0x0;
  }
  this_00 = (QRingBuffer *)pQVar1[1].bindingStorage.d;
  if (this_00 == (QRingBuffer *)0x0) {
    bVar5 = false;
  }
  else {
    qVar4 = QRingBuffer::indexOf(this_00,'\n',maxLength,(qint64)pos);
    bVar5 = -1 < qVar4;
  }
  return bVar5;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }